

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall
CTPNSymDebugLocalBase::CTPNSymDebugLocalBase(CTPNSymDebugLocalBase *this,tcprsdbg_sym_info *info)

{
  int *in_RSI;
  CTcPrsNode *in_RDI;
  
  CTcPrsNode::CTcPrsNode(in_RDI);
  (in_RDI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_003d2938;
  if (*in_RSI == 4) {
    *(int *)&in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = in_RSI[1];
    *(int *)((long)&in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) = in_RSI[2];
    *(int *)&in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = in_RSI[3];
    *(byte *)((long)&in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) =
         *(byte *)((long)&in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) & 0xfe;
  }
  else if (*in_RSI == 5) {
    *(int *)&in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = in_RSI[1];
    *(undefined4 *)((long)&in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) = 0;
    *(int *)&in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = in_RSI[3];
    *(byte *)((long)&in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) =
         *(byte *)((long)&in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) & 0xfe | 1;
  }
  return;
}

Assistant:

CTPNSymDebugLocalBase::CTPNSymDebugLocalBase(const tcprsdbg_sym_info *info)
{
    /* save the type information */
    switch(info->sym_type)
    {
    case TC_SYM_LOCAL:
        var_id_ = info->var_id;
        ctx_arr_idx_ = info->ctx_arr_idx;
        frame_idx_ = info->frame_idx;
        is_param_ = FALSE;
        break;

    case TC_SYM_PARAM:
        var_id_ = info->var_id;
        ctx_arr_idx_ = 0;
        frame_idx_ = info->frame_idx;
        is_param_ = TRUE;
        break;

    default:
        /* other types are invalid */
        assert(FALSE);
        break;
    }
}